

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viewer_device_debug.cpp
# Opt level: O2

Vec3fa __thiscall
embree::renderPixelDebugShader
          (embree *this,DebugShaderData *data,float x,float y,ISPCCamera *camera,RayStats *stats,
          RTCFeatureFlags feature_mask)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  int64_t iVar6;
  int64_t iVar7;
  float fVar8;
  int iVar12;
  undefined1 extraout_var [12];
  undefined1 auVar10 [16];
  ulong uVar9;
  undefined1 auVar11 [16];
  float fVar13;
  float fVar17;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined8 extraout_XMM1_Qb;
  undefined8 extraout_XMM1_Qb_00;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar21;
  Ray ray;
  undefined8 local_f0;
  undefined1 local_e8 [16];
  undefined1 local_d8 [8];
  float fStack_d0;
  float fStack_cc;
  undefined8 local_c8;
  float local_b8;
  float local_b4;
  float fStack_b0;
  undefined8 uStack_ac;
  undefined8 local_a4;
  undefined8 local_88;
  float fStack_80;
  float fStack_7c;
  undefined4 uStack_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined8 *local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined4 local_38;
  
  local_e8._8_4_ = (int)((ulong)*(undefined8 *)((long)&(camera->xfm).p.field_0 + 4) >> 0x20);
  local_e8._0_8_ = *(undefined8 *)&(camera->xfm).p.field_0;
  fVar18 = (camera->xfm).l.vy.field_0.field_0.x * y + (camera->xfm).l.vx.field_0.field_0.x * x +
           (camera->xfm).l.vz.field_0.field_0.x;
  uVar1 = *(undefined8 *)((long)&(camera->xfm).l.vx.field_0 + 4);
  uVar2 = *(undefined8 *)((long)&(camera->xfm).l.vy.field_0 + 4);
  uVar3 = *(undefined8 *)((long)&(camera->xfm).l.vz.field_0 + 4);
  fVar13 = y * (float)uVar2 + (float)uVar1 * x + (float)uVar3;
  fVar17 = y * (float)((ulong)uVar2 >> 0x20) + (float)((ulong)uVar1 >> 0x20) * x +
           (float)((ulong)uVar3 >> 0x20);
  fVar8 = fVar18 * fVar18 + fVar13 * fVar13 + fVar17 * fVar17;
  auVar20 = rsqrtss(ZEXT416((uint)fVar8),ZEXT416((uint)fVar8));
  fVar19 = auVar20._0_4_;
  fVar8 = fVar19 * fVar19 * fVar8 * -0.5 * fVar19 + fVar19 * 1.5;
  local_d8._4_4_ = fVar8 * fVar13;
  local_d8._0_4_ = fVar18 * fVar8;
  fStack_d0 = fVar8 * fVar17;
  local_e8._12_4_ = 0;
  local_c8 = 0xffffffff7f800000;
  local_a4 = 0xffffffffffffffff;
  fStack_cc = data->debug;
  iVar6 = get_tsc();
  if (data->shader == SHADER_OCCLUSION) {
    uStack_70 = 0;
    uStack_6c = 0;
    fStack_80 = 0.0;
    fStack_7c = 0.0;
    uStack_78 = 0;
    uStack_74 = 0;
    local_88 = (ulong)feature_mask << 0x20;
    rtcTraversableOccluded1(data->traversable,local_e8);
    auVar20._8_8_ = extraout_XMM1_Qb;
    auVar20._0_8_ = extraout_XMM1_Qa;
  }
  else {
    uStack_70 = 0;
    uStack_6c = 0;
    fStack_80 = 0.0;
    fStack_7c = 0.0;
    uStack_78 = 0;
    uStack_74 = 0;
    local_88 = (ulong)feature_mask << 0x20;
    rtcTraversableIntersect1(data->traversable,local_e8);
    auVar20._8_8_ = extraout_XMM1_Qb_00;
    auVar20._0_8_ = extraout_XMM1_Qa_00;
  }
  iVar7 = get_tsc();
  stats->numRays = stats->numRays + 1;
  switch(data->shader) {
  case SHADER_EYELIGHT:
    if (local_a4._4_4_ != 0xffffffff) {
      fVar8 = local_b8 * local_b8 + local_b4 * local_b4 + fStack_b0 * fStack_b0;
      auVar20 = rsqrtss(ZEXT416((uint)fVar8),ZEXT416((uint)fVar8));
      fVar13 = auVar20._0_4_;
      fVar13 = fVar13 * fVar13 * fVar8 * -0.5 * fVar13 + fVar13 * 1.5;
      fVar8 = fVar13 * fStack_b0 * fStack_d0 +
              fVar13 * local_b4 * (float)local_d8._4_4_ + local_b8 * fVar13 * (float)local_d8._0_4_;
      uVar9 = CONCAT44(fVar13 * 0.0 * fStack_cc,fVar8) & 0x7fffffff7fffffff;
      if (fStack_b0 * fStack_d0 +
          local_b4 * (float)local_d8._4_4_ + local_b8 * (float)local_d8._0_4_ < 0.0) {
        auVar20 = ZEXT816(0);
        auVar10 = ZEXT416((uint)ABS(fVar8)) << 0x20;
        goto LAB_0011fd76;
      }
      goto LAB_0011fd9a;
    }
    break;
  case SHADER_OCCLUSION:
    auVar20 = ZEXT816(0);
    auVar10 = _DAT_0021efb0;
    if ((float)local_c8 < 0.0) goto LAB_0011fd76;
    break;
  case SHADER_UV:
    if (local_a4._4_4_ != 0xffffffff) {
      fVar8 = (1.0 - (float)uStack_ac) - (float)((ulong)uStack_ac >> 0x20);
      auVar20 = ZEXT416((uint)fVar8);
      auVar10._8_4_ = fVar8;
      auVar10._0_8_ = uStack_ac;
      auVar10._12_4_ = 0.0;
      goto LAB_0011fd76;
    }
    break;
  case SHADER_TEXCOORDS:
  case SHADER_TEXCOORDS_GRID:
    auVar10 = _DAT_0021ee20;
    if ((local_a4._4_4_ != 0xffffffff) &&
       (auVar10 = _DAT_0021efa0, data->ispc_scene != (ISPCScene *)0x0)) {
      local_f0 = 0;
      local_88 = rtcGetGeometry(data->scene);
      fStack_80 = (float)(uint)local_a4;
      fStack_7c = (float)uStack_ac;
      uStack_78 = (undefined4)((ulong)uStack_ac >> 0x20);
      uStack_74 = 2;
      uStack_70 = 2;
      local_60 = 0;
      uStack_58 = 0;
      local_50 = 0;
      uStack_48 = 0;
      local_40 = 0;
      local_38 = 2;
      local_68 = &local_f0;
      rtcInterpolate();
      if (data->shader == SHADER_TEXCOORDS) {
        auVar20 = ZEXT416((uint)local_f0._4_4_);
        auVar10._8_8_ = 0;
        auVar10._0_8_ = local_f0;
      }
      else {
        iVar12 = (int)((float)local_f0 * 10.0);
        auVar20._0_4_ = (float)(iVar12 + (int)(local_f0._4_4_ * 10.0));
        auVar20._4_4_ = iVar12 * 2;
        auVar20._8_4_ = iVar12;
        auVar20._12_4_ = iVar12;
        if (((uint)auVar20._0_4_ & 1) == 0) {
          auVar10._0_12_ = ZEXT812(0x3f800000);
          auVar10._12_4_ = 0.0;
        }
        else {
          auVar10 = ZEXT816(0x3f80000000000000);
        }
      }
    }
    goto LAB_0011fd76;
  case SHADER_NG:
    if (local_a4._4_4_ != 0xffffffff) {
      uVar9 = CONCAT44(local_b4,local_b8);
      fVar8 = local_b4 * local_b4;
      fVar13 = fStack_b0 * fStack_b0;
      fVar17 = fVar8 + local_b8 * local_b8 + fVar13;
      fVar18 = fVar8 + fVar8 + 0.0;
      fVar13 = fVar8 + fVar13 + fVar13;
      fVar8 = fVar8 + 0.0 + 0.0;
      auVar14._4_4_ = fVar18;
      auVar14._0_4_ = fVar17;
      auVar14._8_4_ = fVar13;
      auVar14._12_4_ = fVar8;
      auVar4._4_4_ = fVar18;
      auVar4._0_4_ = fVar17;
      auVar4._8_4_ = fVar13;
      auVar4._12_4_ = fVar8;
      auVar20 = rsqrtss(auVar14,auVar4);
      fVar8 = auVar20._0_4_;
      fVar8 = fVar8 * fVar8 * fVar17 * -0.5 * fVar8 + fVar8 * 1.5;
      auVar16._0_8_ = CONCAT44(fVar8 * local_b4,fVar8 * local_b8) & 0x7fffffff7fffffff;
      auVar16._8_4_ = ABS(fVar8 * fStack_b0);
      auVar16._12_4_ = ABS(fVar8 * 0.0);
      goto LAB_0011fda1;
    }
    break;
  case SHADER_CYCLES:
    auVar11._0_4_ = (float)(iVar7 - iVar6) * data->scale;
    auVar11._4_12_ = extraout_var;
    uVar9 = auVar11._0_8_;
LAB_0011fd9a:
    auVar16 = ZEXT416((uint)uVar9);
LAB_0011fda1:
    aVar21._8_8_ = auVar16._0_8_;
    aVar21._0_8_ = uVar9;
    *(undefined1 (*) [16])this = auVar16;
    return (Vec3fa)aVar21;
  case SHADER_GEOMID:
    if (local_a4._4_4_ != 0xffffffff) {
      aVar21 = (anon_union_16_2_47237d3f_for_Vec3fa_0)randomColor(this,local_a4._4_4_);
      return (Vec3fa)aVar21;
    }
    break;
  case SHADER_GEOMID_PRIMID:
    if (local_a4._4_4_ != 0xffffffff) {
      randomColor((embree *)&local_88,local_a4._4_4_ ^ (uint)local_a4);
      fVar8 = local_b8 * local_b8 + local_b4 * local_b4 + fStack_b0 * fStack_b0;
      auVar20 = rsqrtss(ZEXT416((uint)fVar8),ZEXT416((uint)fVar8));
      fVar13 = auVar20._0_4_;
      fVar13 = fVar13 * fVar13 * fVar8 * -0.5 * fVar13 + fVar13 * 1.5;
      fVar8 = fVar13 * local_b4 * (float)local_d8._4_4_;
      auVar15._4_4_ = fVar8;
      auVar15._0_4_ = fVar8;
      auVar15._8_4_ = fVar8;
      auVar15._12_4_ = fVar8;
      auVar20._4_12_ = auVar15._4_12_;
      auVar20._0_4_ = fVar8 + local_b8 * fVar13 * (float)local_d8._0_4_;
      fVar8 = fVar13 * fStack_b0 * fStack_d0 + auVar20._0_4_;
      auVar10._0_4_ = ABS(fVar8) * (float)local_88;
      auVar10._4_4_ = ABS(fVar8) * local_88._4_4_;
      auVar10._8_4_ = ABS(fVar8) * fStack_80;
      auVar10._12_4_ = ABS(fVar8) * fStack_7c;
      goto LAB_0011fd76;
    }
  }
  auVar10 = ZEXT816(0);
LAB_0011fd76:
  aVar5._8_8_ = auVar20._0_8_;
  aVar5._0_8_ = auVar10._0_8_;
  *(undefined1 (*) [16])this = auVar10;
  return (Vec3fa)aVar5;
}

Assistant:

Vec3fa renderPixelDebugShader(const DebugShaderData& data, float x, float y, const ISPCCamera& camera, RayStats& stats, const RTCFeatureFlags feature_mask)
{
  /* initialize ray */
  Ray ray;
  ray.org = Vec3ff(camera.xfm.p);
  ray.dir = Vec3ff(normalize(x*camera.xfm.l.vx + y*camera.xfm.l.vy + camera.xfm.l.vz));
  ray.tnear() = 0.0f;
  ray.tfar = inf;
  ray.geomID = RTC_INVALID_GEOMETRY_ID;
  ray.primID = RTC_INVALID_GEOMETRY_ID;
  ray.mask = -1;
  ray.time() = data.debug;

  /* intersect ray with scene */
  int64_t c0 = get_tsc();
  if (data.shader == SHADER_OCCLUSION)
  {
    RTCOccludedArguments args;
    rtcInitOccludedArguments(&args);
    args.feature_mask = feature_mask;
    rtcTraversableOccluded1(data.traversable,RTCRay_(ray),&args);
  }
  else
  {
    RTCIntersectArguments args;
    rtcInitIntersectArguments(&args);
    args.feature_mask = feature_mask;
    rtcTraversableIntersect1(data.traversable,RTCRayHit_(ray),&args);
  }

  int64_t c1 = get_tsc();
  RayStats_addRay(stats);

  /* shade pixel */
  switch (data.shader)
  {
  case SHADER_EYELIGHT:
    if (ray.geomID == RTC_INVALID_GEOMETRY_ID)
      return Vec3fa(0.0f);
    else if (dot(ray.dir,ray.Ng) < 0.0f)
      return Vec3fa(0.0f,abs(dot(ray.dir,normalize(ray.Ng))),0.0f);
    else
      return Vec3fa(abs(dot(ray.dir,normalize(ray.Ng))),0.0f,0.0f);

  case SHADER_OCCLUSION:
    if (ray.tfar >= 0.0f) 
      return Vec3fa(0.0f,0.0f,0.0f);
    else 
      return Vec3fa(1.0f,1.0f,1.0f);

  case SHADER_UV:
    if (ray.geomID == RTC_INVALID_GEOMETRY_ID) return Vec3fa(0.0f,0.0f,0.0f);
    else return Vec3fa(ray.u,ray.v,1.0f-ray.u-ray.v);

  case SHADER_TEXCOORDS:
  case SHADER_TEXCOORDS_GRID:

#if !defined(__SYCL_DEVICE_ONLY__)
    if (ray.geomID == RTC_INVALID_GEOMETRY_ID)
      return Vec3fa(0.0f,0.0f,1.0f);

    else if (data.ispc_scene)
    {
      Vec2f st = Vec2f(0,0);
      auto geomID = ray.geomID; {
        RTCGeometry geometry = rtcGetGeometry(data.scene,geomID);
        rtcInterpolate0(geometry,ray.primID,ray.u,ray.v,RTC_BUFFER_TYPE_VERTEX_ATTRIBUTE,2,&st.x,2);
      }
      if (data.shader == SHADER_TEXCOORDS)
        return Vec3fa(st.x,st.y,0.0f);
      else
        return ((int)(10.0f*st.x)+(int)(10.0f*st.y)) % 2 == 0 ? Vec3fa(1,0,0) : Vec3fa(0,1,0);
    }
#endif
    
    return Vec3fa(1.0f);

  case SHADER_NG:

    if (ray.geomID == RTC_INVALID_GEOMETRY_ID) return Vec3fa(0.0f,0.0f,0.0f);
    else return abs(normalize(Vec3fa(ray.Ng.x,ray.Ng.y,ray.Ng.z)));
    //else return normalize(Vec3fa(ray.Ng.x,ray.Ng.y,ray.Ng.z));

  case SHADER_GEOMID:

    if (ray.geomID == RTC_INVALID_GEOMETRY_ID) return Vec3fa(0.0f);
    else return randomColor(ray.geomID);
    
  case SHADER_GEOMID_PRIMID:

    if (ray.geomID == RTC_INVALID_GEOMETRY_ID) return Vec3fa(0.0f);
    else return randomColor(ray.geomID ^ ray.primID)*Vec3fa(abs(dot(ray.dir,normalize(ray.Ng))));
    
  case SHADER_CYCLES:
    return Vec3fa((float)(c1-c0)*data.scale,0.0f,0.0f);
    
  case SHADER_AO:
    return Vec3fa(0,0,0);

  case SHADER_DEFAULT:
    return Vec3fa(0,0,0);
  }
  
  return Vec3fa(0,0,0);
}